

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O3

void Gia_ManBuiltInSimStart(Gia_Man_t *p,int nWords,int nObjs)

{
  uint uVar1;
  Vec_Wrd_t *pVVar2;
  word *pwVar3;
  word Entry;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  Vec_Int_t *pVVar8;
  uint uVar9;
  int iVar10;
  
  if (p->fBuiltInSim != 0) {
    __assert_fail("!p->fBuiltInSim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x30b,"void Gia_ManBuiltInSimStart(Gia_Man_t *, int, int)");
  }
  if (p->nObjs != p->vCis->nSize + p->vCos->nSize + 1) {
    __assert_fail("Gia_ManAndNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x30c,"void Gia_ManBuiltInSimStart(Gia_Man_t *, int, int)");
  }
  p->fBuiltInSim = 1;
  p->iPatsPi = 0;
  p->iPastPiMax = 0;
  p->nSimWordsMax = 8;
  p->nSimWords = nWords;
  Gia_ManRandomW(1);
  uVar1 = p->nSimWords;
  uVar7 = (ulong)uVar1;
  pVVar8 = p->vCis;
  iVar5 = pVVar8->nSize;
  uVar4 = iVar5 * uVar1;
  pVVar2 = (Vec_Wrd_t *)malloc(0x10);
  uVar9 = 0x10;
  if (0xe < uVar4 - 1) {
    uVar9 = uVar4;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = uVar9;
  if (uVar9 == 0) {
    pVVar2->pArray = (word *)0x0;
    p->vSimsPi = pVVar2;
    if (0 < (int)uVar4) {
      sVar6 = (ulong)uVar4 << 3;
LAB_00226b26:
      pwVar3 = (word *)malloc(sVar6);
      goto LAB_00226b2e;
    }
  }
  else {
    pwVar3 = (word *)malloc((long)(int)uVar9 << 3);
    pVVar2->pArray = pwVar3;
    p->vSimsPi = pVVar2;
    if ((int)uVar9 < (int)uVar4) {
      sVar6 = (long)(int)uVar4 << 3;
      if (pwVar3 == (word *)0x0) goto LAB_00226b26;
      pwVar3 = (word *)realloc(pwVar3,sVar6);
LAB_00226b2e:
      pVVar2->pArray = pwVar3;
      if (pwVar3 == (word *)0x0) goto LAB_00226c66;
      pVVar2->nCap = uVar4;
    }
    if (0 < (int)uVar4) {
      memset(pwVar3,0,(ulong)uVar4 << 3);
    }
  }
  pVVar2->nSize = uVar4;
  pVVar2 = (Vec_Wrd_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < nObjs * uVar1 - 1) {
    iVar10 = nObjs * uVar1;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar10;
  if (iVar10 == 0) {
    pVVar2->pArray = (word *)0x0;
    p->vSims = pVVar2;
    if ((int)uVar1 < 1) goto LAB_00226c0e;
    sVar6 = uVar7 * 8;
LAB_00226be4:
    pwVar3 = (word *)malloc(sVar6);
LAB_00226bec:
    pVVar2->pArray = pwVar3;
    if (pwVar3 == (word *)0x0) {
LAB_00226c66:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                    ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    pVVar2->nCap = uVar1;
  }
  else {
    pwVar3 = (word *)malloc((long)iVar10 << 3);
    pVVar2->pArray = pwVar3;
    p->vSims = pVVar2;
    if (iVar10 < (int)uVar1) {
      sVar6 = (long)(int)uVar1 << 3;
      if (pwVar3 == (word *)0x0) goto LAB_00226be4;
      pwVar3 = (word *)realloc(pwVar3,sVar6);
      goto LAB_00226bec;
    }
  }
  if (0 < (int)uVar1) {
    memset(pwVar3,0,uVar7 * 8);
  }
LAB_00226c0e:
  pVVar2->nSize = uVar1;
  if (0 < iVar5) {
    iVar5 = 0;
    do {
      if (0 < (int)uVar7) {
        iVar10 = 0;
        do {
          pVVar2 = p->vSims;
          Entry = Gia_ManRandomW(0);
          Vec_WrdPush(pVVar2,Entry);
          iVar10 = iVar10 + 1;
          uVar7 = (ulong)(uint)p->nSimWords;
        } while (iVar10 < p->nSimWords);
        pVVar8 = p->vCis;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < pVVar8->nSize);
  }
  return;
}

Assistant:

void Gia_ManBuiltInSimStart( Gia_Man_t * p, int nWords, int nObjs )
{
    int i, k;
    assert( !p->fBuiltInSim );
    assert( Gia_ManAndNum(p) == 0 );
    p->fBuiltInSim = 1;
    p->iPatsPi = 0;
    p->iPastPiMax = 0;
    p->nSimWords = nWords;
    p->nSimWordsMax = 8;
    Gia_ManRandomW( 1 );
    // init PI care info
    p->vSimsPi = Vec_WrdAlloc( p->nSimWords * Gia_ManCiNum(p) );
    Vec_WrdFill( p->vSimsPi, p->nSimWords * Gia_ManCiNum(p), 0 );
    // init object sim info
    p->vSims = Vec_WrdAlloc( p->nSimWords * nObjs );
    Vec_WrdFill( p->vSims, p->nSimWords, 0 );
    for ( i = 0; i < Gia_ManCiNum(p); i++ )
        for ( k = 0; k < p->nSimWords; k++ )
            Vec_WrdPush( p->vSims, Gia_ManRandomW(0) );
}